

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zetTracerExpSetPrologues
          (zet_tracer_exp_handle_t hTracer,zet_core_callbacks_t *pCoreCbs)

{
  Logger *this;
  long *plVar1;
  long lVar2;
  ze_result_t result;
  ze_result_t zVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar2 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zetTracerExpSetPrologues(hTracer, pCoreCbs)",&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar2 + 0x810) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar2 + 0xd38) - *(long *)(lVar2 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar2 + 0x810);
    do {
      if (lVar5 == lVar4) {
        if ((*(char *)(lVar2 + 4) != '\x01') ||
           (result = ZETHandleLifetimeValidation::zetTracerExpSetProloguesPrologue
                               ((ZETHandleLifetimeValidation *)(*(long *)(lVar2 + 0xd48) + 0x10),
                                hTracer,pCoreCbs), result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(hTracer,pCoreCbs);
          lVar4 = 0;
          goto LAB_0016330b;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(lVar2 + 0xd30) + lVar4 * 8) + 0x10);
      result = (**(code **)(*plVar1 + 0x240))(plVar1,hTracer,pCoreCbs);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00163339;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(lVar2 + 0xd30) + lVar4 * 8) + 0x10);
    result = (**(code **)(*plVar1 + 0x248))(plVar1,hTracer,pCoreCbs,zVar3);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0016330b:
    result = zVar3;
    if (lVar5 == lVar4) break;
  }
LAB_00163339:
  logAndPropagateResult("zetTracerExpSetPrologues",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetTracerExpSetPrologues(
        zet_tracer_exp_handle_t hTracer,                ///< [in] handle of the tracer
        zet_core_callbacks_t* pCoreCbs                  ///< [in] pointer to table of 'core' callback function pointers
        )
    {
        context.logger->log_trace("zetTracerExpSetPrologues(hTracer, pCoreCbs)");

        auto pfnSetPrologues = context.zetDdiTable.TracerExp.pfnSetPrologues;

        if( nullptr == pfnSetPrologues )
            return logAndPropagateResult("zetTracerExpSetPrologues", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetTracerExpSetProloguesPrologue( hTracer, pCoreCbs );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetTracerExpSetPrologues", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetTracerExpSetProloguesPrologue( hTracer, pCoreCbs );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetTracerExpSetPrologues", result);
        }

        auto driver_result = pfnSetPrologues( hTracer, pCoreCbs );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetTracerExpSetProloguesEpilogue( hTracer, pCoreCbs ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetTracerExpSetPrologues", result);
        }

        return logAndPropagateResult("zetTracerExpSetPrologues", driver_result);
    }